

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

presentation_type fmt::v8::detail::parse_presentation_type<char16_t>(char16_t type)

{
  char16_t cVar1;
  presentation_type local_9;
  char16_t type_local;
  
  cVar1 = to_ascii<char16_t,_0>(type);
  switch(cVar1) {
  case L'A':
    local_9 = hexfloat_upper;
    break;
  case L'B':
    local_9 = bin_upper;
    break;
  default:
    local_9 = none;
    break;
  case L'E':
    local_9 = exp_upper;
    break;
  case L'F':
    local_9 = fixed_upper;
    break;
  case L'G':
    local_9 = general_upper;
    break;
  case L'X':
    local_9 = hex_upper;
    break;
  case L'a':
    local_9 = hexfloat_lower;
    break;
  case L'b':
    local_9 = bin_lower;
    break;
  case L'c':
    local_9 = chr;
    break;
  case L'd':
    local_9 = dec;
    break;
  case L'e':
    local_9 = exp_lower;
    break;
  case L'f':
    local_9 = fixed_lower;
    break;
  case L'g':
    local_9 = general_lower;
    break;
  case L'o':
    local_9 = oct;
    break;
  case L'p':
    local_9 = pointer;
    break;
  case L's':
    local_9 = string;
    break;
  case L'x':
    local_9 = hex_lower;
  }
  return local_9;
}

Assistant:

FMT_CONSTEXPR auto parse_presentation_type(Char type) -> presentation_type {
  switch (to_ascii(type)) {
  case 'd':
    return presentation_type::dec;
  case 'o':
    return presentation_type::oct;
  case 'x':
    return presentation_type::hex_lower;
  case 'X':
    return presentation_type::hex_upper;
  case 'b':
    return presentation_type::bin_lower;
  case 'B':
    return presentation_type::bin_upper;
  case 'a':
    return presentation_type::hexfloat_lower;
  case 'A':
    return presentation_type::hexfloat_upper;
  case 'e':
    return presentation_type::exp_lower;
  case 'E':
    return presentation_type::exp_upper;
  case 'f':
    return presentation_type::fixed_lower;
  case 'F':
    return presentation_type::fixed_upper;
  case 'g':
    return presentation_type::general_lower;
  case 'G':
    return presentation_type::general_upper;
  case 'c':
    return presentation_type::chr;
  case 's':
    return presentation_type::string;
  case 'p':
    return presentation_type::pointer;
  default:
    return presentation_type::none;
  }
}